

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall
CTcTokenizer::load_macros_from_file(CTcTokenizer *this,CVmStream *fp,CTcTokLoadMacErr *err_handler)

{
  int iVar1;
  uint uVar2;
  uint has_varargs;
  uint argc;
  uint uVar3;
  int extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  ulong uVar6;
  void *__s1;
  CTcHashEntryPpDefine *this_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong len;
  char *local_8d8;
  ulong local_8a8;
  char namebuf [80];
  char *argv [128];
  size_t argvlen [128];
  undefined4 extraout_var_01;
  
  local_8a8 = 0x400;
  local_8d8 = (char *)malloc(0x400);
  iVar1 = (*fp->_vptr_CVmStream[8])(fp);
  lVar10 = CONCAT44(extraout_var,iVar1);
  if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
    lVar10 = 0;
  }
  uVar9 = 0;
  lVar7 = 0;
  do {
    if (lVar7 == lVar10) {
      iVar1 = 0;
LAB_0021e872:
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        free(argv[uVar8]);
      }
      free(local_8d8);
      return iVar1;
    }
    uVar2 = (*fp->_vptr_CVmStream[6])(fp);
    if (0x50 < uVar2) {
      iVar1 = 1;
LAB_0021e862:
      (**err_handler->_vptr_CTcTokLoadMacErr)(err_handler,iVar1);
      goto LAB_0021e872;
    }
    len = (ulong)uVar2;
    (*fp->_vptr_CVmStream[0xe])(fp,namebuf,len);
    uVar2 = (*fp->_vptr_CVmStream[6])(fp);
    has_varargs = uVar2 >> 1 & 1;
    argc = (*fp->_vptr_CVmStream[6])(fp);
    for (uVar8 = 0; uVar8 != argc; uVar8 = uVar8 + 1) {
      uVar3 = (*fp->_vptr_CVmStream[6])(fp);
      argvlen[uVar8] = (ulong)uVar3;
      if (0x50 < uVar3) {
        iVar1 = 2;
        goto LAB_0021e862;
      }
      for (; uVar9 <= uVar8; uVar9 = uVar9 + 1) {
        pcVar4 = (char *)malloc(0x50);
        argv[uVar9] = pcVar4;
      }
      (*fp->_vptr_CVmStream[0xe])(fp,argv[uVar8],(ulong)uVar3);
    }
    iVar1 = (*fp->_vptr_CVmStream[8])(fp);
    uVar8 = CONCAT44(extraout_var_00,iVar1);
    if (local_8a8 < uVar8) {
      local_8a8 = uVar8 + 0x200;
      local_8d8 = (char *)realloc(local_8d8,local_8a8);
    }
    (*fp->_vptr_CVmStream[0xe])(fp,local_8d8,uVar8);
    iVar1 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,namebuf,len);
    plVar5 = (long *)CONCAT44(extraout_var_01,iVar1);
    if (plVar5 == (long *)0x0) {
      this_00 = (CTcHashEntryPpDefine *)operator_new(0x68);
      CTcHashEntryPpDefine::CTcHashEntryPpDefine
                (this_00,namebuf,len,1,uVar2 & 1,argc,has_varargs,argv,argvlen,local_8d8,uVar8);
      (*this->defines_->_vptr_CTcMacroTable[2])(this->defines_,this_00);
    }
    else {
      iVar1 = (**(code **)(*plVar5 + 0x40))(plVar5);
      if ((((iVar1 == 0) && ((uVar2 & 1) == (*(byte *)((long)plVar5 + 0x44) & 1))) &&
          (has_varargs == ((*(byte *)((long)plVar5 + 0x44) >> 1 & 1) != 0))) &&
         ((*(uint *)(plVar5 + 8) == argc &&
          (uVar6 = (**(code **)(*plVar5 + 0x30))(plVar5), uVar6 == uVar8)))) {
        __s1 = (void *)(**(code **)(*plVar5 + 0x28))(plVar5);
        iVar1 = bcmp(__s1,local_8d8,uVar8);
        if (iVar1 == 0) goto LAB_0021e84e;
      }
      iVar1 = (**(code **)(*plVar5 + 0x40))(plVar5);
      if (iVar1 == 0) {
        undefine(this,namebuf,len);
      }
    }
LAB_0021e84e:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int CTcTokenizer::load_macros_from_file(CVmStream *fp,
                                        CTcTokLoadMacErr *err_handler)
{
    long cnt;
    long i;
    size_t curarg;
    char *argv[TOK_MAX_MACRO_ARGS];
    size_t argvlen[TOK_MAX_MACRO_ARGS];
    size_t maxarg;
    int result;
    char *expan;
    size_t expmaxlen;

    /* we haven't allocated any argument buffers yet */
    maxarg = 0;

    /* allocate an initial expansion buffer */
    expmaxlen = 1024;
    expan = (char *)t3malloc(expmaxlen);

    /* presume success */
    result = 0;

    /* read the number of macros */
    cnt = fp->read_uint4();

    /* read each macro */
    for (i = 0 ; i < cnt ; ++i)
    {
        char namebuf[TOK_SYM_MAX_LEN];
        size_t namelen;
        int flags;
        size_t argc;
        size_t explen;
        CTcHashEntryPp *entry;
        int has_args;
        int has_varargs;

        /* read the name's length */
        namelen = fp->read_uint2();
        if (namelen > sizeof(namebuf))
        {
            /* log an error through the handler */
            err_handler->log_error(1);

            /* give up - we can't read any more of the file */
            result = 1;
            goto done;
        }

        /* read the name */
        fp->read_bytes(namebuf, namelen);

        /* read and decode the flags */
        flags = fp->read_uint2();
        has_args = ((flags & 1) != 0);
        has_varargs = ((flags & 2) != 0);

        /* read the number of arguments, and read each argument */
        argc = fp->read_uint2();
        for (curarg = 0 ; curarg < argc ; ++curarg)
        {
            /* read the length, and make sure it's valid */
            argvlen[curarg] = fp->read_uint2();
            if (argvlen[curarg] > TOK_SYM_MAX_LEN)
            {
                /* log an error */
                err_handler->log_error(2);

                /* give up - we can't read any more of the file */
                result = 2;
                goto done;
            }

            /* 
             *   if we haven't allocated a buffer for this argument slot yet,
             *   allocate it now; allocate the buffer at the maximum symbol
             *   size, so we can reuse the same buffer for an argument of
             *   other macros we read later 
             */
            while (curarg >= maxarg)
                argv[maxarg++] = (char *)t3malloc(TOK_SYM_MAX_LEN);

            /* read the argument text */
            fp->read_bytes(argv[curarg], argvlen[curarg]);
        }

        /* read the expansion size */
        explen = (size_t)fp->read_uint4();

        /* expand the expansion buffer if necessary */
        if (explen > expmaxlen)
        {
            /* 
             *   overshoot a bit, so that we won't have to reallocate again
             *   if we find a slightly larger expansion for a future macro 
             */
            expmaxlen = explen + 512;

            /* allocate the new buffer */
            expan = (char *)t3realloc(expan, expmaxlen);
        }

        /* read the expansion */
        fp->read_bytes(expan, explen);

        /*
         *   Before we create the entry, check to see if there's an existing
         *   entry with the same name.  
         */
        entry = find_define(namebuf, namelen);
        if (entry != 0)
        {
            /*
             *   We have another entry.  If the entry is exactly the same,
             *   then we can simply skip the current entry, because we simply
             *   want to keep one copy of each macro that's defined
             *   identically in mutiple compilation macros.  If the entry is
             *   different from the new one, delete both - a macro which
             *   appears in two or more compilation units with different
             *   meanings is NOT a global macro, and thus we can't include it
             *   in the debugging records.  
             */
            if (entry->is_pseudo()
                || entry->has_args() != has_args
                || entry->has_varargs() != has_varargs
                || entry->get_argc() != (int)argc
                || entry->get_orig_expan_len() != explen
                || memcmp(entry->get_orig_expansion(), expan, explen) != 0)
            {
                /*
                 *   The existing entry is different from the new entry, so
                 *   the macro has different meanings in different
                 *   compilation units, hence we cannot keep *either*
                 *   definition in the debug records.  Delete the existing
                 *   macro, and do not create the new macro.  If the existing
                 *   macro is a pseudo-macro, keep the old one (since it's
                 *   provided by the compiler itself), but still discard the
                 *   new one.  
                 */
                if (!entry->is_pseudo())
                    undefine(namebuf, namelen);
            }
            else
            {
                /*
                 *   The new entry is identical to the old one, so keep it.
                 *   We only need one copy of the entry, though, so simply
                 *   keep the old one - there's no need to create a new entry
                 *   for the object file data.  
                 */
            }
        }
        else
        {
            /*
             *   There's no existing macro with the same name, so create a
             *   new entry based on the object file data.  
             */
            entry = new CTcHashEntryPpDefine(namebuf, namelen, TRUE,
                                             has_args, argc, has_varargs,
                                             (const char **)argv, argvlen,
                                             expan, explen);

            /* add it to the preprocessor's macro symbol table */
            add_define(entry);
        }
    }

done:
    /* free the argument buffers we allocated */
    for (curarg = 0 ; curarg < maxarg ; ++curarg)
        t3free(argv[curarg]);

    /* free the expansion buffer */
    t3free(expan);

    /* success */
    return result;
}